

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultWriteCordTest_WriteEmptyCordToArray_Test::
DefaultWriteCordTest_WriteEmptyCordToArray_Test
          (DefaultWriteCordTest_WriteEmptyCordToArray_Test *this)

{
  DefaultWriteCordTest_WriteEmptyCordToArray_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DefaultWriteCordTest_WriteEmptyCordToArray_Test_02a1e2c0;
  return;
}

Assistant:

TEST(DefaultWriteCordTest, WriteEmptyCordToArray) {
  absl::Cord source;
  std::string buffer = "abc";
  ArrayOutputStream output(&buffer[0], static_cast<int>(buffer.length()));
  EXPECT_TRUE(output.WriteCord(source));
  EXPECT_EQ(output.ByteCount(), source.size());
  EXPECT_EQ(buffer, "abc");
}